

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O1

int decode_profile_tier_level(GetBitContext *gb,PTLCommon *ptl)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t re_size_plus8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar12 = gb->index;
  iVar5 = -1;
  if (0x57 < (int)(gb->size_in_bits - uVar12)) {
    puVar3 = gb->buffer;
    uVar9 = *(uint *)(puVar3 + (uVar12 >> 3));
    uVar8 = gb->size_in_bits_plus8;
    uVar11 = uVar12 + 2;
    uVar7 = uVar11;
    if (uVar8 < uVar11) {
      uVar7 = uVar8;
    }
    gb->index = uVar7;
    uVar11 = uVar7 + (uVar11 < uVar8);
    ptl->profile_space =
         (byte)(((uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18)
                << ((byte)uVar12 & 7)) >> 0x1e);
    uVar1 = puVar3[uVar7 >> 3];
    gb->index = uVar11;
    ptl->tier_flag = (byte)(uVar1 << ((byte)uVar7 & 7)) >> 7;
    uVar12 = *(uint *)(puVar3 + (uVar11 >> 3));
    uVar9 = (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) <<
            ((byte)uVar11 & 7);
    uVar12 = uVar11 + 5;
    if (uVar8 < uVar11 + 5) {
      uVar12 = uVar8;
    }
    gb->index = uVar12;
    ptl->profile_idc = (byte)(uVar9 >> 0x1b);
    switch(uVar9 >> 0x1b) {
    case 1:
      decode_profile_tier_level_cold_4();
      break;
    case 2:
      decode_profile_tier_level_cold_3();
      break;
    case 3:
      decode_profile_tier_level_cold_2();
      break;
    case 4:
      decode_profile_tier_level_cold_1();
      break;
    default:
      fprintf(_stderr,"Unknown HEVC profile: %d\n");
    }
    uVar10 = (ulong)ptl->profile_idc;
    uVar6 = 0;
    do {
      uVar12 = gb->index;
      bVar2 = gb->buffer[uVar12 >> 3];
      gb->index = uVar12 + (uVar12 < gb->size_in_bits_plus8);
      uVar12 = ((uint)bVar2 << ((byte)uVar12 & 7)) >> 7 & 1;
      ptl->profile_compatibility_flag[uVar6] = (uint8_t)uVar12;
      if (((uVar6 != 0) && ((char)uVar10 == '\0')) && (uVar12 != 0)) {
        ptl->profile_idc = (uint8_t)uVar6;
        uVar10 = uVar6 & 0xffffffff;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x20);
    uVar12 = gb->index;
    puVar3 = gb->buffer;
    uVar9 = gb->size_in_bits_plus8;
    uVar1 = puVar3[uVar12 >> 3];
    uVar8 = uVar12 + (uVar12 < uVar9);
    gb->index = uVar8;
    ptl->progressive_source_flag = (byte)(uVar1 << ((byte)uVar12 & 7)) >> 7;
    uVar12 = uVar12 + (uVar12 < uVar9) + (uint)(uVar8 < uVar9);
    uVar1 = puVar3[uVar8 >> 3];
    gb->index = uVar12;
    ptl->interlaced_source_flag = (byte)(uVar1 << ((byte)uVar8 & 7)) >> 7;
    uVar1 = puVar3[uVar12 >> 3];
    uVar8 = uVar12 + (uVar12 < uVar9);
    uVar4 = uVar12 + (uVar12 < uVar9) + (uint)(uVar8 < uVar9);
    gb->index = uVar8;
    ptl->non_packed_constraint_flag = (byte)(uVar1 << ((byte)uVar12 & 7)) >> 7;
    uVar1 = puVar3[uVar8 >> 3];
    gb->index = uVar4;
    ptl->frame_only_constraint_flag = (byte)(uVar1 << ((byte)uVar8 & 7)) >> 7;
    uVar12 = uVar4 + 0x10;
    if (uVar9 < uVar12) {
      uVar12 = uVar9;
    }
    uVar8 = uVar12 + 0x10;
    if (uVar9 < uVar12 + 0x10) {
      uVar8 = uVar9;
    }
    uVar12 = uVar8 + 0xc;
    if (uVar9 < uVar8 + 0xc) {
      uVar12 = uVar9;
    }
    gb->index = uVar12;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int decode_profile_tier_level(GetBitContext *gb, PTLCommon *ptl)
{
    int i;

    if (get_bits_left(gb) < 2 + 1 + 5 + 32 + 4 + 16 + 16 + 12)
        return -1;
    ptl->profile_space = (uint8_t)get_bits(gb, 2);
    ptl->tier_flag     = (uint8_t)get_bits1(gb);
    ptl->profile_idc   = (uint8_t)get_bits(gb, 5);
    if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN)
        fprintf(stderr, "Main profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN_10)
        fprintf(stderr, "Main 10 profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN_STILL_PICTURE)
        fprintf(stderr, "Main Still Picture profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_REXT)
        fprintf(stderr, "Range Extension profile bitstream\n");
    else
        fprintf(stderr, "Unknown HEVC profile: %d\n", ptl->profile_idc);

    for (i = 0; i < 32; i++) {
        ptl->profile_compatibility_flag[i] = (uint8_t)get_bits1(gb);

        if (ptl->profile_idc == 0 && i > 0 && ptl->profile_compatibility_flag[i])
            ptl->profile_idc = (uint8_t)i;
    }
    ptl->progressive_source_flag    = (uint8_t)get_bits1(gb);
    ptl->interlaced_source_flag     = (uint8_t)get_bits1(gb);
    ptl->non_packed_constraint_flag = (uint8_t)get_bits1(gb);
    ptl->frame_only_constraint_flag = (uint8_t)get_bits1(gb);

    skip_bits(gb, 16); // XXX_reserved_zero_44bits[0..15]
    skip_bits(gb, 16); // XXX_reserved_zero_44bits[16..31]
    skip_bits(gb, 12); // XXX_reserved_zero_44bits[32..43]

    return 0;
}